

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_name_resolver.cc
# Opt level: O0

string * __thiscall
google::protobuf::compiler::java::ClassNameResolver::GetFileClassName_abi_cxx11_
          (string *__return_storage_ptr__,ClassNameResolver *this,FileDescriptor *file,
          bool immutable,bool kotlin)

{
  string local_78;
  string local_48;
  undefined1 local_22;
  undefined1 local_21;
  bool kotlin_local;
  FileDescriptor *pFStack_20;
  bool immutable_local;
  FileDescriptor *file_local;
  ClassNameResolver *this_local;
  
  local_22 = kotlin;
  local_21 = immutable;
  pFStack_20 = file;
  file_local = (FileDescriptor *)this;
  this_local = (ClassNameResolver *)__return_storage_ptr__;
  if (kotlin) {
    GetFileImmutableClassName_abi_cxx11_(&local_48,this,file);
    std::operator+(__return_storage_ptr__,&local_48,"Kt");
    std::__cxx11::string::~string((string *)&local_48);
  }
  else if (immutable) {
    GetFileImmutableClassName_abi_cxx11_(__return_storage_ptr__,this,file);
  }
  else {
    GetFileImmutableClassName_abi_cxx11_(&local_78,this,file);
    std::operator+(__return_storage_ptr__,"Mutable",&local_78);
    std::__cxx11::string::~string((string *)&local_78);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string ClassNameResolver::GetFileClassName(const FileDescriptor* file,
                                                bool immutable, bool kotlin) {
  if (kotlin) {
    return GetFileImmutableClassName(file) + "Kt";
  } else if (immutable) {
    return GetFileImmutableClassName(file);
  } else {
    return "Mutable" + GetFileImmutableClassName(file);
  }
}